

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_31;
  string s;
  
  std::__cxx11::string::string((string *)&s,(string *)FLAGS_gtest_output_abi_cxx11_);
  pcVar1 = strchr(s._M_dataplus._M_p,0x3a);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI,s._M_dataplus._M_p,&local_31);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  std::__cxx11::string::~string((string *)&s);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}